

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::CommittedShaderResources::
DvpVerifyCacheRevisions(CommittedShaderResources *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  const_reference ppSVar3;
  const_reference pvVar4;
  Char *Message;
  char (*in_R8) [219];
  undefined1 local_48 [8];
  string msg;
  ShaderResourceCacheImplType *pCache;
  type_conflict local_18;
  Uint32 Idx;
  Uint32 SRBBit;
  Uint32 ActiveSRBs;
  CommittedShaderResources *this_local;
  
  Idx = (Uint32)this->ActiveSRBMask;
  _SRBBit = this;
  while (Idx != 0) {
    local_18 = ExtractLSB<unsigned_int>(&Idx);
    pCache._4_4_ = LinuxMisc::GetLSB(local_18);
    ppSVar3 = std::array<Diligent::ShaderResourceCacheGL_*,_8UL>::operator[]
                        (&this->ResourceCaches,(ulong)pCache._4_4_);
    msg.field_2._8_8_ = *ppSVar3;
    if ((value_type)msg.field_2._8_8_ != (value_type)0x0) {
      pvVar4 = std::array<unsigned_int,_8UL>::operator[](&this->CacheRevisions,(ulong)pCache._4_4_);
      uVar1 = *pvVar4;
      uVar2 = ShaderResourceCacheBase::DvpGetRevision((ShaderResourceCacheBase *)msg.field_2._8_8_);
      if (uVar1 != uVar2) {
        FormatString<char[48],unsigned_int,char[219]>
                  ((string *)local_48,(Diligent *)"Revision of the shader resource cache at index ",
                   (char (*) [48])((long)&pCache + 4),
                   (uint *)
                   " does not match the revision recorded when the SRB was committed. This indicates that resources have been changed since that time, but the SRB has not been committed with CommitShaderResources(). This usage is invalid."
                   ,in_R8);
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"DvpVerifyCacheRevisions",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x1be);
        std::__cxx11::string::~string((string *)local_48);
      }
    }
  }
  return;
}

Assistant:

void DvpVerifyCacheRevisions() const
        {
            for (Uint32 ActiveSRBs = ActiveSRBMask; ActiveSRBs != 0;)
            {
                const Uint32                       SRBBit = ExtractLSB(ActiveSRBs);
                const Uint32                       Idx    = PlatformMisc::GetLSB(SRBBit);
                const ShaderResourceCacheImplType* pCache = ResourceCaches[Idx];
                if (pCache != nullptr)
                {
                    DEV_CHECK_ERR(CacheRevisions[Idx] == pCache->DvpGetRevision(),
                                  "Revision of the shader resource cache at index ", Idx,
                                  " does not match the revision recorded when the SRB was committed. "
                                  "This indicates that resources have been changed since that time, but "
                                  "the SRB has not been committed with CommitShaderResources(). This usage is invalid.");
                }
                else
                {
                    // This error will be handled by DvpValidateCommittedShaderResources.
                }
            }
        }